

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::LRN_x86_avx512::forward_inplace(LRN_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  int *piVar32;
  pointer piVar33;
  Mat *pMVar34;
  Mat *pMVar35;
  int k;
  Mat *pMVar36;
  ulong uVar37;
  uint top;
  ulong uVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  undefined1 (*pauVar44) [32];
  _func_int ***ppp_Var45;
  float *pfVar46;
  _func_int ***ppp_Var47;
  int j;
  int iVar48;
  uint uVar49;
  int q;
  void *pvVar50;
  int iVar51;
  int iVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  allocator_type local_1a9;
  Mat *local_1a8;
  LRN_x86_avx512 *local_1a0;
  Mat local_198;
  Mat *local_150;
  _func_int ***local_148;
  Mat *local_140;
  undefined1 local_138 [16];
  Mat local_128;
  undefined1 local_d8 [32];
  Allocator *local_b0;
  long local_a8;
  long local_a0;
  void *local_98;
  Mat *local_90;
  long local_88;
  long local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  undefined1 auVar58 [32];
  undefined1 auVar61 [32];
  
  auVar55 = local_d8;
  local_d8._4_4_ = 0;
  local_d8._0_4_ = bottom_top_blob->w;
  local_1a8 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  ppp_Var45 = (_func_int ***)bottom_top_blob->elemsize;
  local_128.cstep = 0;
  local_128.data = (Allocator *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_128.elempack = 0;
  local_d8._8_24_ = auVar55._8_24_;
  local_1a0 = (LRN_x86_avx512 *)CONCAT44(local_1a0._4_4_,bottom_top_blob->c);
  local_128.allocator = (Allocator *)local_128.data;
  local_128.dims = (int)local_128.refcount;
  local_128.w = local_128.refcount._4_4_;
  local_128._48_8_ = local_128.elemsize;
  local_128.c = local_128.elempack;
  Mat::create(&local_128,bottom_top_blob->w,bottom_top_blob->h,bottom_top_blob->c,(size_t)ppp_Var45,
              opt->workspace_allocator);
  iVar48 = -100;
  if (((Allocator *)local_128.data == (Allocator *)0x0) ||
     ((long)local_128.c * local_128.cstep == 0)) goto LAB_002ecb3a;
  local_138._0_8_ = opt;
  iVar52 = local_d8._0_4_;
  local_80 = (long)iVar52;
  iVar48 = (int)local_1a8 * iVar52;
  pMVar34 = (Mat *)0x0;
  local_150 = (Mat *)0x0;
  if (0 < (int)local_1a0) {
    local_150 = (Mat *)((ulong)local_1a0 & 0xffffffff);
  }
  for (; pMVar34 != local_150; pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
    pvVar50 = bottom_top_blob->data;
    sVar1 = bottom_top_blob->elemsize;
    sVar2 = bottom_top_blob->cstep;
    pfVar46 = (float *)(sVar2 * (long)pMVar34 * sVar1 + (long)pvVar50);
    ppp_Var47 = (_func_int ***)
                ((long)(_func_int ***)local_128.data +
                local_128.cstep * (long)pMVar34 * local_128.elemsize);
    lVar41 = 0;
    for (iVar51 = 0; iVar51 + 7 < iVar48; iVar51 = iVar51 + 8) {
      auVar55._4_4_ = pfVar46[1] * pfVar46[1];
      auVar55._0_4_ = *pfVar46 * *pfVar46;
      auVar55._8_4_ = pfVar46[2] * pfVar46[2];
      auVar55._12_4_ = pfVar46[3] * pfVar46[3];
      auVar55._16_4_ = pfVar46[4] * pfVar46[4];
      auVar55._20_4_ = pfVar46[5] * pfVar46[5];
      auVar55._24_4_ = pfVar46[6] * pfVar46[6];
      auVar55._28_4_ = pfVar46[7];
      *(undefined1 (*) [32])ppp_Var47 = auVar55;
      pfVar46 = pfVar46 + 8;
      ppp_Var47 = ppp_Var47 + 4;
      lVar41 = lVar41 + 8;
    }
    for (; (int)lVar41 < iVar48; lVar41 = lVar41 + 1) {
      fVar62 = *(float *)((long)pvVar50 + lVar41 * 4 + sVar2 * sVar1 * (long)pMVar34);
      *(float *)((long)(_func_int ***)local_128.data +
                lVar41 * 4 + local_128.cstep * local_128.elemsize * (long)pMVar34) = fVar62 * fVar62
      ;
    }
  }
  iVar51 = (this->super_LRN).region_type;
  local_148 = ppp_Var45;
  if (iVar51 == 0) {
    local_198.cstep = 0;
    local_198.data = (Allocator *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,iVar52,(int)local_1a8,(int)local_1a0,(size_t)ppp_Var45,
                opt->workspace_allocator);
    if (((Allocator *)local_198.data == (Allocator *)0x0) ||
       (local_198.cstep * (long)local_198.c == 0)) {
      piVar32 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
      iVar48 = -100;
      if (piVar32 == (int *)0x0) goto LAB_002ecb3a;
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 != 0) goto LAB_002ecb3a;
      if (local_198.allocator != (Allocator *)0x0) {
        (*(local_198.allocator)->_vptr_Allocator[3])();
        goto LAB_002ecb3a;
      }
LAB_002ecb8e:
      iVar48 = -100;
      free(local_198.data);
      goto LAB_002ecb3a;
    }
    uVar49 = (int)local_198.cstep * local_198.c;
    uVar38 = 0;
    uVar37 = (ulong)uVar49;
    if ((int)uVar49 < 1) {
      uVar37 = uVar38;
    }
    for (; (int)uVar37 != (int)uVar38; uVar38 = uVar38 + 1) {
      *(undefined4 *)((long)(_func_int ***)local_198.data + uVar38 * 4) = 0;
    }
    local_138._0_4_ = (this->super_LRN).alpha / (float)(this->super_LRN).local_size;
    local_138._4_12_ = SUB6012((undefined1  [60])0x0,0);
    local_d8._4_4_ = local_138._0_4_;
    local_d8._0_4_ = local_138._0_4_;
    local_d8._8_4_ = local_138._0_4_;
    local_d8._12_4_ = local_138._0_4_;
    local_d8._16_4_ = local_138._0_4_;
    local_d8._20_4_ = local_138._0_4_;
    local_d8._24_4_ = local_138._0_4_;
    local_d8._28_4_ = local_138._0_4_;
    local_140 = bottom_top_blob;
    for (pMVar34 = (Mat *)0x0; pvVar50 = local_198.data, pMVar34 != local_150;
        pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
      iVar52 = (this->super_LRN).local_size;
      for (uVar49 = iVar52 / -2 + (int)pMVar34; (int)uVar49 <= iVar52 / 2 + (int)pMVar34;
          uVar49 = uVar49 + 1) {
        if ((int)uVar49 < (int)local_1a0 && -1 < (int)uVar49) {
          ppp_Var47 = (_func_int ***)
                      ((long)(_func_int ***)local_128.data +
                      local_128.cstep * uVar49 * local_128.elemsize);
          lVar43 = local_198.cstep * (long)pMVar34 *
                   CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
          ppp_Var45 = (_func_int ***)((long)(_func_int ***)local_198.data + lVar43);
          lVar41 = 0;
          for (iVar52 = 0; iVar52 + 7 < iVar48; iVar52 = iVar52 + 8) {
            auVar56._0_4_ = *(float *)ppp_Var45 + *(float *)ppp_Var47;
            auVar56._4_4_ = *(float *)((long)ppp_Var45 + 4) + *(float *)((long)ppp_Var47 + 4);
            auVar56._8_4_ = *(float *)(ppp_Var45 + 1) + *(float *)(ppp_Var47 + 1);
            auVar56._12_4_ =
                 *(float *)((long)(ppp_Var45 + 1) + 4) + *(float *)((long)(ppp_Var47 + 1) + 4);
            auVar56._16_4_ = *(float *)(ppp_Var45 + 2) + *(float *)(ppp_Var47 + 2);
            auVar56._20_4_ =
                 *(float *)((long)(ppp_Var45 + 2) + 4) + *(float *)((long)(ppp_Var47 + 2) + 4);
            auVar56._24_4_ = *(float *)(ppp_Var45 + 3) + *(float *)(ppp_Var47 + 3);
            auVar56._28_4_ =
                 *(float *)((long)(ppp_Var45 + 3) + 4) + *(float *)((long)(ppp_Var47 + 3) + 4);
            *(undefined1 (*) [32])ppp_Var45 = auVar56;
            ppp_Var47 = ppp_Var47 + 4;
            ppp_Var45 = ppp_Var45 + 4;
            lVar41 = lVar41 + 8;
          }
          for (; (int)lVar41 < iVar48; lVar41 = lVar41 + 1) {
            *(float *)((long)(_func_int ***)local_198.data + lVar41 * 4 + lVar43) =
                 *(float *)((long)(_func_int ***)local_198.data + lVar41 * 4 + lVar43) +
                 *(float *)((long)(_func_int ***)local_128.data +
                           lVar41 * 4 + local_128.cstep * local_128.elemsize * (ulong)uVar49);
          }
          iVar52 = (this->super_LRN).local_size;
        }
      }
      pvVar3 = local_140->data;
      sVar1 = local_140->elemsize;
      sVar2 = local_140->cstep;
      pauVar44 = (undefined1 (*) [32])(sVar2 * (long)pMVar34 * sVar1 + (long)pvVar3);
      ppp_Var45 = (_func_int ***)
                  ((long)(_func_int ***)local_198.data +
                  local_198.cstep * (long)pMVar34 *
                  CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize));
      fVar62 = (this->super_LRN).bias;
      auVar63._4_4_ = fVar62;
      auVar63._0_4_ = fVar62;
      auVar63._8_4_ = fVar62;
      auVar63._12_4_ = fVar62;
      auVar63._16_4_ = fVar62;
      auVar63._20_4_ = fVar62;
      auVar63._24_4_ = fVar62;
      auVar63._28_4_ = fVar62;
      auVar54._8_4_ = 0x80000000;
      auVar54._0_8_ = 0x8000000080000000;
      auVar54._12_4_ = 0x80000000;
      auVar54 = vxorps_avx512vl(ZEXT416((uint)(this->super_LRN).beta),auVar54);
      fVar62 = auVar54._0_4_;
      lVar41 = 0;
      for (iVar52 = 0; iVar52 + 7 < iVar48; iVar52 = iVar52 + 8) {
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [32])ppp_Var45,auVar63,local_d8);
        uVar37 = vcmpps_avx512vl(ZEXT1632(auVar54),_DAT_00539a00,2);
        auVar57._8_4_ = 0x800000;
        auVar57._0_8_ = 0x80000000800000;
        auVar57._12_4_ = 0x800000;
        auVar57._16_4_ = 0x800000;
        auVar57._20_4_ = 0x800000;
        auVar57._24_4_ = 0x800000;
        auVar57._28_4_ = 0x800000;
        auVar55 = vmaxps_avx512vl(ZEXT1632(auVar54),auVar57);
        auVar65 = vpsrld_avx2(auVar55,0x17);
        auVar66._8_4_ = 0x807fffff;
        auVar66._0_8_ = 0x807fffff807fffff;
        auVar66._12_4_ = 0x807fffff;
        auVar66._16_4_ = 0x807fffff;
        auVar66._20_4_ = 0x807fffff;
        auVar66._24_4_ = 0x807fffff;
        auVar66._28_4_ = 0x807fffff;
        auVar60._8_4_ = 0x3f000000;
        auVar60._0_8_ = 0x3f0000003f000000;
        auVar60._12_4_ = 0x3f000000;
        auVar60._16_4_ = 0x3f000000;
        auVar60._20_4_ = 0x3f000000;
        auVar60._24_4_ = 0x3f000000;
        auVar60._28_4_ = 0x3f000000;
        auVar55 = vpternlogd_avx512vl(auVar55,auVar66,auVar60,0xea);
        auVar9._8_4_ = 0x3f3504f3;
        auVar9._0_8_ = 0x3f3504f33f3504f3;
        auVar9._12_4_ = 0x3f3504f3;
        auVar9._16_4_ = 0x3f3504f3;
        auVar9._20_4_ = 0x3f3504f3;
        auVar9._24_4_ = 0x3f3504f3;
        auVar9._28_4_ = 0x3f3504f3;
        uVar38 = vcmpps_avx512vl(auVar55,auVar9,1);
        auVar10._8_4_ = 0xbf800000;
        auVar10._0_8_ = 0xbf800000bf800000;
        auVar10._12_4_ = 0xbf800000;
        auVar10._16_4_ = 0xbf800000;
        auVar10._20_4_ = 0xbf800000;
        auVar10._24_4_ = 0xbf800000;
        auVar10._28_4_ = 0xbf800000;
        auVar56 = vaddps_avx512vl(auVar55,auVar10);
        auVar57 = vaddps_avx512vl(auVar56,auVar55);
        bVar4 = (bool)((byte)uVar38 & 1);
        auVar58._0_4_ = (float)((uint)bVar4 * auVar57._0_4_ | (uint)!bVar4 * auVar56._0_4_);
        bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar58._4_4_ = (float)((uint)bVar4 * auVar57._4_4_ | (uint)!bVar4 * auVar56._4_4_);
        bVar4 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar58._8_4_ = (float)((uint)bVar4 * auVar57._8_4_ | (uint)!bVar4 * auVar56._8_4_);
        bVar4 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar58._12_4_ = (float)((uint)bVar4 * auVar57._12_4_ | (uint)!bVar4 * auVar56._12_4_);
        bVar4 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar58._16_4_ = (float)((uint)bVar4 * auVar57._16_4_ | (uint)!bVar4 * auVar56._16_4_);
        bVar4 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar58._20_4_ = (float)((uint)bVar4 * auVar57._20_4_ | (uint)!bVar4 * auVar56._20_4_);
        bVar4 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar58._24_4_ = (float)((uint)bVar4 * auVar57._24_4_ | (uint)!bVar4 * auVar56._24_4_);
        bVar4 = SUB81(uVar38 >> 7,0);
        auVar58._28_4_ = (uint)bVar4 * auVar57._28_4_ | (uint)!bVar4 * auVar56._28_4_;
        auVar27._4_4_ = auVar58._4_4_ * auVar58._4_4_;
        auVar27._0_4_ = auVar58._0_4_ * auVar58._0_4_;
        auVar27._8_4_ = auVar58._8_4_ * auVar58._8_4_;
        auVar27._12_4_ = auVar58._12_4_ * auVar58._12_4_;
        auVar27._16_4_ = auVar58._16_4_ * auVar58._16_4_;
        auVar27._20_4_ = auVar58._20_4_ * auVar58._20_4_;
        auVar27._24_4_ = auVar58._24_4_ * auVar58._24_4_;
        auVar27._28_4_ = auVar55._28_4_;
        auVar67._8_4_ = 0x3d9021bb;
        auVar67._0_8_ = 0x3d9021bb3d9021bb;
        auVar67._12_4_ = 0x3d9021bb;
        auVar67._16_4_ = 0x3d9021bb;
        auVar67._20_4_ = 0x3d9021bb;
        auVar67._24_4_ = 0x3d9021bb;
        auVar67._28_4_ = 0x3d9021bb;
        auVar11._8_4_ = 0xbdebd1b8;
        auVar11._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar11._12_4_ = 0xbdebd1b8;
        auVar11._16_4_ = 0xbdebd1b8;
        auVar11._20_4_ = 0xbdebd1b8;
        auVar11._24_4_ = 0xbdebd1b8;
        auVar11._28_4_ = 0xbdebd1b8;
        auVar55 = vfmadd213ps_avx512vl(auVar67,auVar58,auVar11);
        auVar12._8_4_ = 0x3def251a;
        auVar12._0_8_ = 0x3def251a3def251a;
        auVar12._12_4_ = 0x3def251a;
        auVar12._16_4_ = 0x3def251a;
        auVar12._20_4_ = 0x3def251a;
        auVar12._24_4_ = 0x3def251a;
        auVar12._28_4_ = 0x3def251a;
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar12);
        auVar13._8_4_ = 0xbdfe5d4f;
        auVar13._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar13._12_4_ = 0xbdfe5d4f;
        auVar13._16_4_ = 0xbdfe5d4f;
        auVar13._20_4_ = 0xbdfe5d4f;
        auVar13._24_4_ = 0xbdfe5d4f;
        auVar13._28_4_ = 0xbdfe5d4f;
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar13);
        auVar14._8_4_ = 0x3e11e9bf;
        auVar14._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar14._12_4_ = 0x3e11e9bf;
        auVar14._16_4_ = 0x3e11e9bf;
        auVar14._20_4_ = 0x3e11e9bf;
        auVar14._24_4_ = 0x3e11e9bf;
        auVar14._28_4_ = 0x3e11e9bf;
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar14);
        auVar15._8_4_ = 0xbe2aae50;
        auVar15._0_8_ = 0xbe2aae50be2aae50;
        auVar15._12_4_ = 0xbe2aae50;
        auVar15._16_4_ = 0xbe2aae50;
        auVar15._20_4_ = 0xbe2aae50;
        auVar15._24_4_ = 0xbe2aae50;
        auVar15._28_4_ = 0xbe2aae50;
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar15);
        auVar16._8_4_ = 0x3e4cceac;
        auVar16._0_8_ = 0x3e4cceac3e4cceac;
        auVar16._12_4_ = 0x3e4cceac;
        auVar16._16_4_ = 0x3e4cceac;
        auVar16._20_4_ = 0x3e4cceac;
        auVar16._24_4_ = 0x3e4cceac;
        auVar16._28_4_ = 0x3e4cceac;
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar16);
        auVar17._8_4_ = 0xbe7ffffc;
        auVar17._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar17._12_4_ = 0xbe7ffffc;
        auVar17._16_4_ = 0xbe7ffffc;
        auVar17._20_4_ = 0xbe7ffffc;
        auVar17._24_4_ = 0xbe7ffffc;
        auVar17._28_4_ = 0xbe7ffffc;
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar17);
        auVar18._8_4_ = 0x3eaaaaaa;
        auVar18._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar18._12_4_ = 0x3eaaaaaa;
        auVar18._16_4_ = 0x3eaaaaaa;
        auVar18._20_4_ = 0x3eaaaaaa;
        auVar18._24_4_ = 0x3eaaaaaa;
        auVar18._28_4_ = 0x3eaaaaaa;
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar18);
        auVar28._4_4_ = auVar58._4_4_ * auVar58._4_4_ * auVar58._4_4_ * auVar55._4_4_;
        auVar28._0_4_ = auVar58._0_4_ * auVar58._0_4_ * auVar58._0_4_ * auVar55._0_4_;
        auVar28._8_4_ = auVar58._8_4_ * auVar58._8_4_ * auVar58._8_4_ * auVar55._8_4_;
        auVar28._12_4_ = auVar58._12_4_ * auVar58._12_4_ * auVar58._12_4_ * auVar55._12_4_;
        auVar28._16_4_ = auVar58._16_4_ * auVar58._16_4_ * auVar58._16_4_ * auVar55._16_4_;
        auVar28._20_4_ = auVar58._20_4_ * auVar58._20_4_ * auVar58._20_4_ * auVar55._20_4_;
        auVar28._24_4_ = auVar58._24_4_ * auVar58._24_4_ * auVar58._24_4_ * auVar55._24_4_;
        auVar28._28_4_ = auVar55._28_4_;
        auVar19._8_4_ = 0xffffff82;
        auVar19._0_8_ = 0xffffff82ffffff82;
        auVar19._12_4_ = 0xffffff82;
        auVar19._16_4_ = 0xffffff82;
        auVar19._20_4_ = 0xffffff82;
        auVar19._24_4_ = 0xffffff82;
        auVar19._28_4_ = 0xffffff82;
        auVar55 = vpaddd_avx512vl(auVar65,auVar19);
        auVar55 = vcvtdq2ps_avx(auVar55);
        auVar70._8_4_ = 0x3f800000;
        auVar70._0_8_ = 0x3f8000003f800000;
        auVar70._12_4_ = 0x3f800000;
        auVar70._16_4_ = 0x3f800000;
        auVar70._20_4_ = 0x3f800000;
        auVar70._24_4_ = 0x3f800000;
        auVar70._28_4_ = 0x3f800000;
        auVar56 = vsubps_avx512vl(auVar55,auVar70);
        bVar4 = (bool)((byte)uVar38 & 1);
        auVar59._0_4_ = (uint)bVar4 * auVar56._0_4_ | (uint)!bVar4 * auVar55._0_4_;
        bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar4 * auVar56._4_4_ | (uint)!bVar4 * auVar55._4_4_;
        bVar4 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar4 * auVar56._8_4_ | (uint)!bVar4 * auVar55._8_4_;
        bVar4 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar59._12_4_ = (uint)bVar4 * auVar56._12_4_ | (uint)!bVar4 * auVar55._12_4_;
        bVar4 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar59._16_4_ = (uint)bVar4 * auVar56._16_4_ | (uint)!bVar4 * auVar55._16_4_;
        bVar4 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar59._20_4_ = (uint)bVar4 * auVar56._20_4_ | (uint)!bVar4 * auVar55._20_4_;
        bVar4 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar59._24_4_ = (uint)bVar4 * auVar56._24_4_ | (uint)!bVar4 * auVar55._24_4_;
        bVar4 = SUB81(uVar38 >> 7,0);
        auVar59._28_4_ = (uint)bVar4 * auVar56._28_4_ | (uint)!bVar4 * auVar55._28_4_;
        auVar71._8_4_ = 0xb95e8083;
        auVar71._0_8_ = 0xb95e8083b95e8083;
        auVar71._12_4_ = 0xb95e8083;
        auVar71._16_4_ = 0xb95e8083;
        auVar71._20_4_ = 0xb95e8083;
        auVar71._24_4_ = 0xb95e8083;
        auVar71._28_4_ = 0xb95e8083;
        auVar54 = vfmadd231ps_fma(auVar28,auVar59,auVar71);
        auVar72._8_4_ = 0x3f000000;
        auVar72._0_8_ = 0x3f0000003f000000;
        auVar72._12_4_ = 0x3f000000;
        auVar72._16_4_ = 0x3f000000;
        auVar72._20_4_ = 0x3f000000;
        auVar72._24_4_ = 0x3f000000;
        auVar72._28_4_ = 0x3f000000;
        auVar54 = vfmsub231ps_fma(ZEXT1632(auVar54),auVar72,auVar27);
        auVar55 = vsubps_avx(ZEXT1632(auVar54),auVar58);
        auVar68._8_4_ = 0x3f318000;
        auVar68._0_8_ = 0x3f3180003f318000;
        auVar68._12_4_ = 0x3f318000;
        auVar68._16_4_ = 0x3f318000;
        auVar68._20_4_ = 0x3f318000;
        auVar68._24_4_ = 0x3f318000;
        auVar68._28_4_ = 0x3f318000;
        auVar54 = vfmsub231ps_fma(auVar55,auVar68,auVar59);
        auVar55 = vpcmpeqd_avx2(auVar59,auVar59);
        bVar4 = (bool)((byte)uVar37 & 1);
        bVar5 = (bool)((byte)(uVar37 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar29._4_4_ = (float)((uint)bVar5 * auVar55._4_4_ | (uint)!bVar5 * auVar54._4_4_) * fVar62
        ;
        auVar29._0_4_ = (float)((uint)bVar4 * auVar55._0_4_ | (uint)!bVar4 * auVar54._0_4_) * fVar62
        ;
        auVar29._8_4_ = (float)((uint)bVar6 * auVar55._8_4_ | (uint)!bVar6 * auVar54._8_4_) * fVar62
        ;
        auVar29._12_4_ =
             (float)((uint)bVar7 * auVar55._12_4_ | (uint)!bVar7 * auVar54._12_4_) * fVar62;
        auVar29._16_4_ = (float)((uint)((byte)(uVar37 >> 4) & 1) * auVar55._16_4_) * fVar62;
        auVar29._20_4_ = (float)((uint)((byte)(uVar37 >> 5) & 1) * auVar55._20_4_) * fVar62;
        auVar29._24_4_ = (float)((uint)((byte)(uVar37 >> 6) & 1) * auVar55._24_4_) * fVar62;
        auVar29._28_4_ = (uint)(byte)(uVar37 >> 7) * auVar55._28_4_;
        auVar65._8_4_ = 0x42b0c0a5;
        auVar65._0_8_ = 0x42b0c0a542b0c0a5;
        auVar65._12_4_ = 0x42b0c0a5;
        auVar65._16_4_ = 0x42b0c0a5;
        auVar65._20_4_ = 0x42b0c0a5;
        auVar65._24_4_ = 0x42b0c0a5;
        auVar65._28_4_ = 0x42b0c0a5;
        auVar55 = vminps_avx512vl(auVar29,auVar65);
        auVar20._8_4_ = 0xc2b0c0a5;
        auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar20._12_4_ = 0xc2b0c0a5;
        auVar20._16_4_ = 0xc2b0c0a5;
        auVar20._20_4_ = 0xc2b0c0a5;
        auVar20._24_4_ = 0xc2b0c0a5;
        auVar20._28_4_ = 0xc2b0c0a5;
        auVar56 = vmaxps_avx512vl(auVar55,auVar20);
        auVar21._8_4_ = 0x3fb8aa3b;
        auVar21._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar21._12_4_ = 0x3fb8aa3b;
        auVar21._16_4_ = 0x3fb8aa3b;
        auVar21._20_4_ = 0x3fb8aa3b;
        auVar21._24_4_ = 0x3fb8aa3b;
        auVar21._28_4_ = 0x3fb8aa3b;
        auVar57 = vfmadd231ps_avx512vl(auVar72,auVar56,auVar21);
        auVar55 = vroundps_avx(auVar57,1);
        uVar37 = vcmpps_avx512vl(auVar57,auVar55,1);
        auVar60 = vsubps_avx512vl(auVar55,auVar70);
        bVar4 = (bool)((byte)uVar37 & 1);
        auVar61._0_4_ = (float)((uint)bVar4 * auVar60._0_4_ | (uint)!bVar4 * auVar55._0_4_);
        bVar4 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar61._4_4_ = (float)((uint)bVar4 * auVar60._4_4_ | (uint)!bVar4 * auVar55._4_4_);
        bVar4 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar61._8_4_ = (float)((uint)bVar4 * auVar60._8_4_ | (uint)!bVar4 * auVar55._8_4_);
        bVar4 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar61._12_4_ = (float)((uint)bVar4 * auVar60._12_4_ | (uint)!bVar4 * auVar55._12_4_);
        bVar4 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar61._16_4_ = (float)((uint)bVar4 * auVar60._16_4_ | (uint)!bVar4 * auVar55._16_4_);
        bVar4 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar61._20_4_ = (float)((uint)bVar4 * auVar60._20_4_ | (uint)!bVar4 * auVar55._20_4_);
        bVar4 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar61._24_4_ = (float)((uint)bVar4 * auVar60._24_4_ | (uint)!bVar4 * auVar55._24_4_);
        bVar4 = SUB81(uVar37 >> 7,0);
        auVar61._28_4_ = (float)((uint)bVar4 * auVar60._28_4_ | (uint)!bVar4 * auVar55._28_4_);
        auVar54 = vfmsub231ps_fma(auVar56,auVar61,auVar68);
        auVar54 = vfnmsub231ps_fma(ZEXT1632(auVar54),auVar61,auVar71);
        auVar56 = ZEXT1632(auVar54);
        auVar30._28_4_ = auVar57._28_4_;
        auVar30._0_28_ =
             ZEXT1628(CONCAT412(auVar54._12_4_ * auVar54._12_4_,
                                CONCAT48(auVar54._8_4_ * auVar54._8_4_,
                                         CONCAT44(auVar54._4_4_ * auVar54._4_4_,
                                                  auVar54._0_4_ * auVar54._0_4_))));
        auVar69._8_4_ = 0x39506967;
        auVar69._0_8_ = 0x3950696739506967;
        auVar69._12_4_ = 0x39506967;
        auVar69._16_4_ = 0x39506967;
        auVar69._20_4_ = 0x39506967;
        auVar69._24_4_ = 0x39506967;
        auVar69._28_4_ = 0x39506967;
        auVar22._8_4_ = 0x3ab743ce;
        auVar22._0_8_ = 0x3ab743ce3ab743ce;
        auVar22._12_4_ = 0x3ab743ce;
        auVar22._16_4_ = 0x3ab743ce;
        auVar22._20_4_ = 0x3ab743ce;
        auVar22._24_4_ = 0x3ab743ce;
        auVar22._28_4_ = 0x3ab743ce;
        auVar55 = vfmadd213ps_avx512vl(auVar69,auVar56,auVar22);
        auVar23._8_4_ = 0x3c088908;
        auVar23._0_8_ = 0x3c0889083c088908;
        auVar23._12_4_ = 0x3c088908;
        auVar23._16_4_ = 0x3c088908;
        auVar23._20_4_ = 0x3c088908;
        auVar23._24_4_ = 0x3c088908;
        auVar23._28_4_ = 0x3c088908;
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar56,auVar23);
        auVar24._8_4_ = 0x3d2aa9c1;
        auVar24._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar24._12_4_ = 0x3d2aa9c1;
        auVar24._16_4_ = 0x3d2aa9c1;
        auVar24._20_4_ = 0x3d2aa9c1;
        auVar24._24_4_ = 0x3d2aa9c1;
        auVar24._28_4_ = 0x3d2aa9c1;
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar56,auVar24);
        auVar25._8_4_ = 0x3e2aaaaa;
        auVar25._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar25._12_4_ = 0x3e2aaaaa;
        auVar25._16_4_ = 0x3e2aaaaa;
        auVar25._20_4_ = 0x3e2aaaaa;
        auVar25._24_4_ = 0x3e2aaaaa;
        auVar25._28_4_ = 0x3e2aaaaa;
        auVar56 = ZEXT1632(auVar54);
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar56,auVar25);
        auVar54 = vfmadd213ps_fma(auVar55,auVar56,auVar72);
        auVar54 = vfmadd213ps_fma(ZEXT1632(auVar54),auVar30,auVar56);
        auVar64._0_4_ = (int)auVar61._0_4_;
        auVar64._4_4_ = (int)auVar61._4_4_;
        auVar64._8_4_ = (int)auVar61._8_4_;
        auVar64._12_4_ = (int)auVar61._12_4_;
        auVar64._16_4_ = (int)auVar61._16_4_;
        auVar64._20_4_ = (int)auVar61._20_4_;
        auVar64._24_4_ = (int)auVar61._24_4_;
        auVar64._28_4_ = (int)auVar61._28_4_;
        auVar55 = vpslld_avx2(auVar64,0x17);
        auVar26._8_4_ = 0x3f800000;
        auVar26._0_8_ = 0x3f8000003f800000;
        auVar26._12_4_ = 0x3f800000;
        auVar26._16_4_ = 0x3f800000;
        auVar26._20_4_ = 0x3f800000;
        auVar26._24_4_ = 0x3f800000;
        auVar26._28_4_ = 0x3f800000;
        auVar55 = vpaddd_avx512vl(auVar55,auVar26);
        auVar31._4_4_ = auVar55._4_4_ * *(float *)((long)*pauVar44 + 4);
        auVar31._0_4_ = auVar55._0_4_ * *(float *)*pauVar44;
        auVar31._8_4_ = auVar55._8_4_ * *(float *)((long)*pauVar44 + 8);
        auVar31._12_4_ = auVar55._12_4_ * *(float *)((long)*pauVar44 + 0xc);
        auVar31._16_4_ = auVar55._16_4_ * *(float *)((long)*pauVar44 + 0x10);
        auVar31._20_4_ = auVar55._20_4_ * *(float *)((long)*pauVar44 + 0x14);
        auVar31._24_4_ = auVar55._24_4_ * *(float *)((long)*pauVar44 + 0x18);
        auVar31._28_4_ = auVar55._28_4_;
        auVar54 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar54),auVar31);
        *pauVar44 = ZEXT1632(auVar54);
        ppp_Var45 = ppp_Var45 + 4;
        pauVar44 = pauVar44 + 1;
        lVar41 = lVar41 + 8;
      }
      lVar43 = sVar2 * sVar1 * (long)pMVar34;
      lVar39 = local_198.cstep * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      for (; (int)lVar41 < iVar48; lVar41 = lVar41 + 1) {
        auVar54 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)(_func_int ***)pvVar50 +
                                                   lVar41 * 4 + lVar39 * (long)pMVar34)),local_138,
                                  ZEXT416((uint)(this->super_LRN).bias));
        auVar53._8_4_ = 0x80000000;
        auVar53._0_8_ = 0x8000000080000000;
        auVar53._12_4_ = 0x80000000;
        auVar53 = vxorps_avx512vl(ZEXT416((uint)(this->super_LRN).beta),auVar53);
        fVar62 = powf(auVar54._0_4_,auVar53._0_4_);
        *(float *)((long)pvVar3 + lVar41 * 4 + lVar43) =
             fVar62 * *(float *)((long)pvVar3 + lVar41 * 4 + lVar43);
      }
    }
    piVar32 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if (local_198.allocator == (Allocator *)0x0) goto LAB_002ecb2d;
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    iVar48 = 0;
    if (iVar51 != 1) goto LAB_002ecb3a;
    piVar32 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
    local_198.data = local_128.data;
    local_198.refcount._0_4_ = (int)local_128.refcount;
    local_198.refcount._4_4_ = local_128.refcount._4_4_;
    local_198.elemsize._0_4_ = (undefined4)local_128.elemsize;
    local_198.elemsize._4_4_ = (undefined4)(local_128.elemsize >> 0x20);
    local_198.elempack = local_128.elempack;
    local_198.allocator = local_128.allocator;
    local_198.dims = local_128.dims;
    local_198.w = local_128.w;
    local_198.h = local_128.h;
    local_198.d = local_128.d;
    local_198.c = local_128.c;
    local_198.cstep = local_128.cstep;
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + 1;
      UNLOCK();
    }
    uVar49 = (this->super_LRN).local_size;
    if (1 < (int)uVar49) {
      top = uVar49 >> 1;
      stack0xffffffffffffff98 = SUB6448(*opt,0x10);
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = SUB648(*opt,0);
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_128,&local_198,top,~top + uVar49,top,~top + uVar49,0,0.0,
                       (Option *)&_space_ofs);
      iVar48 = -100;
      if (((Allocator *)local_198.data == (Allocator *)0x0) ||
         ((long)local_198.c * local_198.cstep == 0)) {
        piVar32 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
        if (piVar32 == (int *)0x0) goto LAB_002ecb3a;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_002ecb3a;
        if (local_198.allocator != (Allocator *)0x0) {
          (*(local_198.allocator)->_vptr_Allocator[3])();
          goto LAB_002ecb3a;
        }
        goto LAB_002ecb8e;
      }
      uVar49 = (this->super_LRN).local_size;
      iVar52 = local_198.w;
    }
    uVar49 = uVar49 * uVar49;
    local_138._0_4_ = (this->super_LRN).alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar49,&local_1a9);
    piVar33 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar48 = (this->super_LRN).local_size;
    iVar52 = iVar52 - iVar48;
    lVar41 = 0;
    iVar51 = 0;
    for (iVar40 = 0; iVar40 < iVar48; iVar40 = iVar40 + 1) {
      for (lVar43 = 0; iVar42 = (int)lVar43, iVar42 < iVar48; lVar43 = lVar43 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar41 + lVar43] = iVar51 + iVar42;
        iVar48 = (this->super_LRN).local_size;
      }
      iVar51 = iVar51 + iVar52 + iVar42;
      lVar41 = (int)lVar41 + lVar43;
    }
    local_98 = bottom_top_blob->data;
    local_a0 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
    local_a8 = local_198.cstep * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
    local_88 = (long)local_198.w * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize)
    ;
    pMVar36 = (Mat *)0x0;
    pMVar34 = (Mat *)(local_d8._0_8_ & 0xffffffff);
    if (local_d8._0_4_ < 1) {
      pMVar34 = pMVar36;
    }
    local_b0 = (Allocator *)local_198.data;
    iVar48 = (int)local_1a8;
    local_1a8 = (Mat *)((ulong)local_1a8 & 0xffffffff);
    if (iVar48 < 1) {
      local_1a8 = pMVar36;
    }
    local_d8._0_4_ = 1.0 / (float)(int)uVar49;
    local_1a0 = this;
    while (pMVar36 != local_150) {
      pvVar50 = (void *)(local_a0 * (long)pMVar36 + (long)local_98);
      local_148 = (_func_int ***)((long)&local_b0->_vptr_Allocator + local_a8 * (long)pMVar36);
      pMVar35 = (Mat *)0x0;
      local_90 = pMVar36;
      while (ppp_Var45 = local_148, pMVar35 != local_1a8) {
        lVar41 = local_88 * (long)pMVar35;
        local_140 = pMVar35;
        for (pMVar36 = (Mat *)0x0; pMVar36 != pMVar34; pMVar36 = (Mat *)((long)&pMVar36->data + 1))
        {
          fVar62 = 0.0;
          for (uVar37 = 0; uVar49 != uVar37; uVar37 = uVar37 + 1) {
            fVar62 = fVar62 + *(float *)((long)ppp_Var45 +
                                        (long)piVar33[uVar37] * 4 + (long)pMVar36 * 4 + lVar41);
          }
          auVar54 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 * (float)local_138._0_4_)),
                                    ZEXT416((uint)local_d8._0_4_),
                                    ZEXT416((uint)(local_1a0->super_LRN).bias));
          auVar8._8_4_ = 0x80000000;
          auVar8._0_8_ = 0x8000000080000000;
          auVar8._12_4_ = 0x80000000;
          auVar53 = vxorps_avx512vl(ZEXT416((uint)(local_1a0->super_LRN).beta),auVar8);
          fVar62 = powf(auVar54._0_4_,auVar53._0_4_);
          *(float *)((long)pvVar50 + (long)pMVar36 * 4) =
               fVar62 * *(float *)((long)pvVar50 + (long)pMVar36 * 4);
        }
        pvVar50 = (void *)((long)pvVar50 + local_80 * 4);
        pMVar35 = (Mat *)((long)&local_140->data + 1);
      }
      pMVar36 = (Mat *)((long)&local_90->data + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    piVar32 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
LAB_002ecb2d:
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar48 = 0;
LAB_002ecb3a:
  piVar32 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar48;
}

Assistant:

int LRN_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}